

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bcp.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_ce22::BlockCopyWrapper::BlockCopyWrapper
          (BlockCopyWrapper *this,string *data_type,int input_start_number,int input_end_number,
          int input_block_length,int output_start_number,int output_block_length,double pad_value)

{
  int iVar1;
  BlockCopyInterface *pBVar2;
  uint uVar3;
  uint uVar4;
  undefined **ppuVar5;
  
  this->block_copy_ = (BlockCopyInterface *)0x0;
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x20);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_001189a8;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
LAB_001056dc:
    *(char *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 4) = (char)(int)pad_value;
    *(undefined1 *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 5) = 0;
    goto LAB_001057e6;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x20);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_001189f8;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
LAB_00105710:
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
    *(short *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 4) = (short)(int)pad_value;
    *(undefined1 *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 6) = 0;
    goto LAB_001057e6;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x20);
    uVar4 = (uint)pad_value;
    uVar3 = uVar4 & 0x7fffff;
    if ((uVar4 >> 0x17 & 1) != 0) {
      uVar3 = uVar4;
    }
    ppuVar5 = &PTR__BlockCopy_00118a38;
LAB_0010574e:
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)ppuVar5;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
    *(char *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 4) = (char)uVar3;
    *(char *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 5) = (char)(uVar3 >> 8);
    *(char *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 6) = (char)(uVar3 >> 0x10);
    *(undefined1 *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 7) = 0;
    goto LAB_001057e6;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x28);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118a78;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
    *(int *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 4) = (int)pad_value;
    goto LAB_001057a9;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x30);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118ab8;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
    pBVar2[4]._vptr_BlockCopyInterface = (_func_int **)(long)pad_value;
    goto LAB_001057e2;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x20);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118af8;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
    goto LAB_001056dc;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x20);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118b38;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    goto LAB_00105710;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x20);
    uVar3 = (uint)pad_value;
    ppuVar5 = &PTR__BlockCopy_00118b78;
    goto LAB_0010574e;
  }
  iVar1 = std::__cxx11::string::compare((char *)data_type);
  if (iVar1 == 0) {
    pBVar2 = (BlockCopyInterface *)operator_new(0x28);
    pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118bb8;
    *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
    *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
    *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
    *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
    *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
    *(int *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 4) = (int)(long)pad_value;
LAB_001057a9:
    *(undefined1 *)&pBVar2[4]._vptr_BlockCopyInterface = 0;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)data_type);
    if (iVar1 == 0) {
      pBVar2 = (BlockCopyInterface *)operator_new(0x30);
      pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118bf8;
      *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
      *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
      *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
      *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
      *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
      pBVar2[4]._vptr_BlockCopyInterface =
           (_func_int **)
           ((long)(pad_value - 9.223372036854776e+18) & (long)pad_value >> 0x3f | (long)pad_value);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)data_type);
      if (iVar1 == 0) {
        pBVar2 = (BlockCopyInterface *)operator_new(0x28);
        pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118c38;
        *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
        *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
        *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
        *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
        *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
        *(float *)((long)&pBVar2[3]._vptr_BlockCopyInterface + 4) = (float)pad_value;
        goto LAB_001057a9;
      }
      iVar1 = std::__cxx11::string::compare((char *)data_type);
      if (iVar1 != 0) {
        iVar1 = std::__cxx11::string::compare((char *)data_type);
        if (iVar1 == 0) {
          pBVar2 = (BlockCopyInterface *)operator_new(0x40);
          pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118cb8;
          *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
          *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
          *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
          *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
          *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
          *(longdouble *)(pBVar2 + 4) = (longdouble)pad_value;
          *(undefined1 *)&pBVar2[6]._vptr_BlockCopyInterface = 0;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)data_type);
          if (iVar1 != 0) {
            return;
          }
          pBVar2 = (BlockCopyInterface *)operator_new(0x40);
          pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118cb8;
          *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
          *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
          *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
          *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
          *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
          *(longdouble *)(pBVar2 + 4) = (longdouble)pad_value;
          *(undefined1 *)&pBVar2[6]._vptr_BlockCopyInterface = 1;
        }
        goto LAB_001057e6;
      }
      pBVar2 = (BlockCopyInterface *)operator_new(0x30);
      pBVar2->_vptr_BlockCopyInterface = (_func_int **)&PTR__BlockCopyInterface_00118c78;
      *(int *)&pBVar2[1]._vptr_BlockCopyInterface = input_start_number;
      *(int *)((long)&pBVar2[1]._vptr_BlockCopyInterface + 4) = input_end_number;
      *(int *)&pBVar2[2]._vptr_BlockCopyInterface = input_block_length;
      *(int *)((long)&pBVar2[2]._vptr_BlockCopyInterface + 4) = output_start_number;
      *(int *)&pBVar2[3]._vptr_BlockCopyInterface = output_block_length;
      pBVar2[4]._vptr_BlockCopyInterface = (_func_int **)pad_value;
    }
LAB_001057e2:
    *(undefined1 *)&pBVar2[5]._vptr_BlockCopyInterface = 0;
  }
LAB_001057e6:
  this->block_copy_ = pBVar2;
  return;
}

Assistant:

BlockCopyWrapper(const std::string& data_type, int input_start_number,
                   int input_end_number, int input_block_length,
                   int output_start_number, int output_block_length,
                   double pad_value)
      : block_copy_(NULL) {
    if ("c" == data_type) {
      block_copy_ = new BlockCopy<std::int8_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("s" == data_type) {
      block_copy_ = new BlockCopy<std::int16_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("h" == data_type) {
      block_copy_ = new BlockCopy<sptk::int24_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, sptk::int24_t(pad_value));
    } else if ("i" == data_type) {
      block_copy_ = new BlockCopy<std::int32_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("l" == data_type) {
      block_copy_ = new BlockCopy<std::int64_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("C" == data_type) {
      block_copy_ = new BlockCopy<std::uint8_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("S" == data_type) {
      block_copy_ = new BlockCopy<std::uint16_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("H" == data_type) {
      block_copy_ = new BlockCopy<sptk::uint24_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, sptk::uint24_t(pad_value));
    } else if ("I" == data_type) {
      block_copy_ = new BlockCopy<std::uint32_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("L" == data_type) {
      block_copy_ = new BlockCopy<std::uint64_t>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("f" == data_type) {
      block_copy_ = new BlockCopy<float>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("d" == data_type) {
      block_copy_ = new BlockCopy<double>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("e" == data_type) {
      block_copy_ = new BlockCopy<long double>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value);
    } else if ("a" == data_type) {
      block_copy_ = new BlockCopy<long double>(
          input_start_number, input_end_number, input_block_length,
          output_start_number, output_block_length, pad_value, true);
    }
  }